

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void quoteFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long lVar1;
  sqlite3 *db_00;
  sqlite3_context *in_RDX;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  sqlite3 *db;
  sqlite3_str str;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  sqlite3 *local_28;
  char *local_20;
  sqlite3_value *pValue;
  u8 uVar2;
  StrAccum *pStr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  pValue = (sqlite3_value *)&DAT_aaaaaaaaaaaaaaaa;
  pStr = (StrAccum *)&DAT_aaaaaaaaaaaaaaaa;
  db_00 = sqlite3_context_db_handle(in_RDI);
  sqlite3StrAccumInit((StrAccum *)&local_28,db_00,(char *)0x0,0,db_00->aLimit[0]);
  sqlite3QuoteValue(pStr,pValue);
  uVar2 = (u8)((ulong)pStr >> 0x20);
  sqlite3StrAccumFinish((StrAccum *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  sqlite3_result_text(in_RDX,(char *)db_00,(int)((ulong)in_RDI >> 0x20),
                      (_func_void_void_ptr *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (uVar2 != '\0') {
    sqlite3_result_null((sqlite3_context *)0x224ca6);
    sqlite3_result_error_code(in_RDI,in_stack_ffffffffffffffac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void quoteFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  sqlite3_str str;
  sqlite3 *db = sqlite3_context_db_handle(context);
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  sqlite3StrAccumInit(&str, db, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
  sqlite3QuoteValue(&str,argv[0]);
  sqlite3_result_text(context, sqlite3StrAccumFinish(&str), str.nChar,
                      SQLITE_DYNAMIC);
  if( str.accError!=SQLITE_OK ){
    sqlite3_result_null(context);
    sqlite3_result_error_code(context, str.accError);
  }
}